

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O1

bool check_event(Am_Object *inter,Am_Object *event_window,Am_Input_Char input_char,
                Am_Slot_Key when_slot,Am_Input_Char *deferred)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Value slot_value;
  Am_Value list_value;
  Am_Value_List choices;
  Am_Value local_60;
  Am_Value local_50;
  Am_Value_List local_40;
  
  local_60.type = 0;
  local_60.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar3 = Am_Object::Get(inter,when_slot,1);
  Am_Value::operator=(&local_60,pAVar3);
  Am_Input_Char::operator=(deferred,&Am_No_Input_Char);
  bVar1 = Am_Value_List::Test(&local_60);
  if (bVar1) {
    Am_Value_List::Am_Value_List(&local_40,&local_60);
    local_50.type = 0;
    local_50.value.wrapper_value = (Am_Wrapper *)0x0;
    Am_Value_List::Start(&local_40);
    while( true ) {
      bVar1 = Am_Value_List::Last(&local_40);
      if (bVar1) break;
      pAVar3 = Am_Value_List::Get(&local_40);
      Am_Value::operator=(&local_50,pAVar3);
      bVar2 = int_check_event(inter,event_window,input_char,0,&local_50,deferred);
      if (bVar2) break;
      Am_Value_List::Next(&local_40);
    }
    bVar1 = !bVar1;
    Am_Value::~Am_Value(&local_50);
    Am_Value_List::~Am_Value_List(&local_40);
  }
  else {
    bVar1 = int_check_event(inter,event_window,input_char,when_slot,&local_60,deferred);
  }
  Am_Value::~Am_Value(&local_60);
  return bVar1;
}

Assistant:

static bool
check_event(Am_Object &inter, Am_Object &event_window, Am_Input_Char input_char,
            Am_Slot_Key when_slot, Am_Input_Char &deferred)
{
  Am_Value slot_value;
  slot_value = inter.Peek(when_slot);
  deferred = Am_No_Input_Char; //normal case

#ifdef DEBUG
  if (Am_Inter_Tracing(inter)) {
    std::cout << "Checking ";
    switch (when_slot) {
    case Am_START_WHEN:
      std::cout << "start";
      break;
    case Am_ABORT_WHEN:
      std::cout << "abort";
      break;
    case Am_STOP_WHEN:
      std::cout << "stop";
      break;
    }
    std::cout << " event = ";
  }
#endif
  if (Am_Value_List::Test(slot_value)) {
    Am_Value_List choices = slot_value;
    Am_Value list_value;
    Am_INTER_TRACE_PRINT(inter, " LIST");
    for (choices.Start(); !choices.Last(); choices.Next()) {
      list_value = choices.Get();
      Am_INTER_TRACE_PRINT_NOENDL(inter, "  Checking ");
      if (int_check_event(inter, event_window, input_char, 0, list_value,
                          deferred))
        return true;
    }
    return false; //nothing in the list matches
  } else
    return int_check_event(inter, event_window, input_char, when_slot,
                           slot_value, deferred);
}